

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O2

int run_tests(int64_t *sizes,int sizes_cnt,int type)

{
  utimbuf *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  EVP_PKEY_CTX *ctx;
  char **tbs;
  code *tbs_00;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  size_t siglen_02;
  size_t siglen_03;
  size_t siglen_04;
  size_t siglen_05;
  size_t siglen_06;
  size_t siglen_07;
  size_t siglen_08;
  size_t siglen_09;
  size_t siglen_10;
  size_t siglen_11;
  size_t siglen_12;
  utimbuf *puVar5;
  char *pcVar6;
  EVP_PKEY_CTX *pEVar7;
  size_t in_R8;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  
  ctx = (EVP_PKEY_CTX *)malloc(0x52080);
  tbs = test_names;
  uVar8 = 0;
  printf("-------\nRunning tests with %s:\n",test_names[type]);
  printf("%-29s","extra.h yysort1_int64");
  uVar9 = (ulong)(uint)sizes_cnt;
  if (sizes_cnt < 1) {
    uVar9 = uVar8;
  }
  dVar10 = 0.0;
  bVar2 = false;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    puVar1 = (utimbuf *)sizes[uVar8];
    puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
    pEVar7 = ctx;
    fill((int64_t *)ctx,(int)puVar1,type);
    utime((char *)pEVar7,puVar5);
    puVar5 = puVar1;
    pEVar7 = ctx;
    yysort1_int64((int64_t *)ctx,(size_t)puVar1);
    utime((char *)pEVar7,puVar5);
    iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen,(uchar *)tbs,in_R8);
    if (iVar4 == 0) {
      bVar2 = false;
      break;
    }
    dVar10 = dVar10 + (extraout_XMM0_Qa_00 - extraout_XMM0_Qa);
    bVar2 = true;
  }
  pcVar6 = "ok";
  if (!bVar2) {
    pcVar6 = "FAILED";
  }
  printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
  bVar3 = false;
  fflush((FILE *)0x0);
  if (bVar2) {
    printf("%-29s","extra.h yysort2_int64");
    dVar10 = 0.0;
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      puVar1 = (utimbuf *)sizes[uVar8];
      puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
      pEVar7 = ctx;
      fill((int64_t *)ctx,(int)puVar1,type);
      utime((char *)pEVar7,puVar5);
      puVar5 = puVar1;
      pEVar7 = ctx;
      yysort2_int64((int64_t *)ctx,(size_t)puVar1);
      utime((char *)pEVar7,puVar5);
      iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_00,(uchar *)tbs,in_R8);
      if (iVar4 == 0) {
        bVar3 = false;
        break;
      }
      dVar10 = dVar10 + (extraout_XMM0_Qa_02 - extraout_XMM0_Qa_01);
      bVar3 = true;
    }
    pcVar6 = "ok";
    if (!bVar3) {
      pcVar6 = "FAILED";
    }
    printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
    bVar2 = false;
    fflush((FILE *)0x0);
    if (bVar3) {
      printf("%-29s","extra.h radix_sort7_int64");
      dVar10 = 0.0;
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        puVar1 = (utimbuf *)sizes[uVar8];
        puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
        pEVar7 = ctx;
        fill((int64_t *)ctx,(int)puVar1,type);
        utime((char *)pEVar7,puVar5);
        puVar5 = puVar1;
        pEVar7 = ctx;
        radix_sort7_int64((int64_t *)ctx,(size_t)puVar1);
        utime((char *)pEVar7,puVar5);
        iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_01,(uchar *)tbs,in_R8);
        if (iVar4 == 0) {
          bVar2 = false;
          break;
        }
        dVar10 = dVar10 + (extraout_XMM0_Qa_04 - extraout_XMM0_Qa_03);
        bVar2 = true;
      }
      pcVar6 = "ok";
      if (!bVar2) {
        pcVar6 = "FAILED";
      }
      printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
      bVar3 = false;
      fflush((FILE *)0x0);
      if (bVar2) {
        printf("%-29s","sort.h tim_sort");
        dVar10 = 0.0;
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          puVar1 = (utimbuf *)sizes[uVar8];
          puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
          pEVar7 = ctx;
          fill((int64_t *)ctx,(int)puVar1,type);
          utime((char *)pEVar7,puVar5);
          puVar5 = puVar1;
          pEVar7 = ctx;
          sorter_tim_sort((int64_t *)ctx,(size_t)puVar1);
          utime((char *)pEVar7,puVar5);
          iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_02,(uchar *)tbs,in_R8);
          if (iVar4 == 0) {
            bVar3 = false;
            break;
          }
          dVar10 = dVar10 + (extraout_XMM0_Qa_06 - extraout_XMM0_Qa_05);
          bVar3 = true;
        }
        pcVar6 = "ok";
        if (!bVar3) {
          pcVar6 = "FAILED";
        }
        printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
        bVar2 = false;
        fflush((FILE *)0x0);
        if (bVar3) {
          printf("%-29s","sort.h quick_sort");
          dVar10 = 0.0;
          for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            puVar1 = (utimbuf *)sizes[uVar8];
            puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
            pEVar7 = ctx;
            fill((int64_t *)ctx,(int)puVar1,type);
            utime((char *)pEVar7,puVar5);
            puVar5 = puVar1;
            pEVar7 = ctx;
            sorter_quick_sort((int64_t *)ctx,(size_t)puVar1);
            utime((char *)pEVar7,puVar5);
            iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_03,(uchar *)tbs,in_R8);
            if (iVar4 == 0) {
              bVar2 = false;
              break;
            }
            dVar10 = dVar10 + (extraout_XMM0_Qa_08 - extraout_XMM0_Qa_07);
            bVar2 = true;
          }
          pcVar6 = "ok";
          if (!bVar2) {
            pcVar6 = "FAILED";
          }
          printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
          bVar3 = false;
          fflush((FILE *)0x0);
          if (bVar2) {
            printf("%-29s","extra.h std_sort_int64");
            dVar10 = 0.0;
            for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
              puVar1 = (utimbuf *)sizes[uVar8];
              puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
              pEVar7 = ctx;
              fill((int64_t *)ctx,(int)puVar1,type);
              utime((char *)pEVar7,puVar5);
              puVar5 = puVar1;
              pEVar7 = ctx;
              std_sort_int64((int64_t *)ctx,(size_t)puVar1);
              utime((char *)pEVar7,puVar5);
              iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_04,(uchar *)tbs,in_R8)
              ;
              if (iVar4 == 0) {
                bVar3 = false;
                break;
              }
              dVar10 = dVar10 + (extraout_XMM0_Qa_10 - extraout_XMM0_Qa_09);
              bVar3 = true;
            }
            pcVar6 = "ok";
            if (!bVar3) {
              pcVar6 = "FAILED";
            }
            printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
            bVar2 = false;
            fflush((FILE *)0x0);
            if (bVar3) {
              printf("%-29s","extra.h std_stable_int64");
              dVar10 = 0.0;
              for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                puVar1 = (utimbuf *)sizes[uVar8];
                puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                pEVar7 = ctx;
                fill((int64_t *)ctx,(int)puVar1,type);
                utime((char *)pEVar7,puVar5);
                puVar5 = puVar1;
                pEVar7 = ctx;
                std_stable_int64((int64_t *)ctx,(size_t)puVar1);
                utime((char *)pEVar7,puVar5);
                iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_05,(uchar *)tbs,
                               in_R8);
                if (iVar4 == 0) {
                  bVar2 = false;
                  break;
                }
                dVar10 = dVar10 + (extraout_XMM0_Qa_12 - extraout_XMM0_Qa_11);
                bVar2 = true;
              }
              pcVar6 = "ok";
              if (!bVar2) {
                pcVar6 = "FAILED";
              }
              printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
              bVar3 = false;
              fflush((FILE *)0x0);
              if (bVar2) {
                printf("%-29s","sort.h heap_sort");
                dVar10 = 0.0;
                for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                  puVar1 = (utimbuf *)sizes[uVar8];
                  puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                  pEVar7 = ctx;
                  fill((int64_t *)ctx,(int)puVar1,type);
                  utime((char *)pEVar7,puVar5);
                  puVar5 = puVar1;
                  pEVar7 = ctx;
                  sorter_heap_sort((int64_t *)ctx,(size_t)puVar1);
                  utime((char *)pEVar7,puVar5);
                  iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_06,(uchar *)tbs,
                                 in_R8);
                  if (iVar4 == 0) {
                    bVar3 = false;
                    break;
                  }
                  dVar10 = dVar10 + (extraout_XMM0_Qa_14 - extraout_XMM0_Qa_13);
                  bVar3 = true;
                }
                pcVar6 = "ok";
                if (!bVar3) {
                  pcVar6 = "FAILED";
                }
                printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                bVar2 = false;
                fflush((FILE *)0x0);
                if (bVar3) {
                  printf("%-29s","sort.h merge_sort");
                  dVar10 = 0.0;
                  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                    puVar1 = (utimbuf *)sizes[uVar8];
                    puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                    pEVar7 = ctx;
                    fill((int64_t *)ctx,(int)puVar1,type);
                    utime((char *)pEVar7,puVar5);
                    puVar5 = puVar1;
                    pEVar7 = ctx;
                    sorter_merge_sort((int64_t *)ctx,(size_t)puVar1);
                    utime((char *)pEVar7,puVar5);
                    iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_07,(uchar *)tbs,
                                   in_R8);
                    if (iVar4 == 0) {
                      bVar2 = false;
                      break;
                    }
                    dVar10 = dVar10 + (extraout_XMM0_Qa_16 - extraout_XMM0_Qa_15);
                    bVar2 = true;
                  }
                  pcVar6 = "ok";
                  if (!bVar2) {
                    pcVar6 = "FAILED";
                  }
                  printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                  bVar3 = false;
                  fflush((FILE *)0x0);
                  if (bVar2) {
                    printf("%-29s","sort.h shell_sort");
                    dVar10 = 0.0;
                    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                      puVar1 = (utimbuf *)sizes[uVar8];
                      puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                      pEVar7 = ctx;
                      fill((int64_t *)ctx,(int)puVar1,type);
                      utime((char *)pEVar7,puVar5);
                      puVar5 = puVar1;
                      pEVar7 = ctx;
                      sorter_shell_sort((int64_t *)ctx,(size_t)puVar1);
                      utime((char *)pEVar7,puVar5);
                      iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_08,
                                     (uchar *)tbs,in_R8);
                      if (iVar4 == 0) {
                        bVar3 = false;
                        break;
                      }
                      dVar10 = dVar10 + (extraout_XMM0_Qa_18 - extraout_XMM0_Qa_17);
                      bVar3 = true;
                    }
                    pcVar6 = "ok";
                    if (!bVar3) {
                      pcVar6 = "FAILED";
                    }
                    printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                    bVar2 = false;
                    fflush((FILE *)0x0);
                    if (bVar3) {
                      printf("%-29s","sort.h merge_sort_in_place");
                      dVar10 = 0.0;
                      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                        puVar1 = (utimbuf *)sizes[uVar8];
                        puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                        pEVar7 = ctx;
                        fill((int64_t *)ctx,(int)puVar1,type);
                        utime((char *)pEVar7,puVar5);
                        puVar5 = puVar1;
                        pEVar7 = ctx;
                        sorter_merge_sort_in_place((int64_t *)ctx,(size_t)puVar1);
                        utime((char *)pEVar7,puVar5);
                        iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_09,
                                       (uchar *)tbs,in_R8);
                        if (iVar4 == 0) {
                          bVar2 = false;
                          break;
                        }
                        dVar10 = dVar10 + (extraout_XMM0_Qa_20 - extraout_XMM0_Qa_19);
                        bVar2 = true;
                      }
                      pcVar6 = "ok";
                      if (!bVar2) {
                        pcVar6 = "FAILED";
                      }
                      printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                      bVar3 = false;
                      fflush((FILE *)0x0);
                      if (bVar2) {
                        printf("%-29s","sort.h grail_sort");
                        dVar10 = 0.0;
                        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                          puVar1 = (utimbuf *)sizes[uVar8];
                          puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                          pEVar7 = ctx;
                          fill((int64_t *)ctx,(int)puVar1,type);
                          utime((char *)pEVar7,puVar5);
                          puVar5 = puVar1;
                          pEVar7 = ctx;
                          sorter_grail_sort((int64_t *)ctx,(size_t)puVar1);
                          utime((char *)pEVar7,puVar5);
                          iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_10,
                                         (uchar *)tbs,in_R8);
                          if (iVar4 == 0) {
                            bVar3 = false;
                            break;
                          }
                          dVar10 = dVar10 + (extraout_XMM0_Qa_22 - extraout_XMM0_Qa_21);
                          bVar3 = true;
                        }
                        pcVar6 = "ok";
                        if (!bVar3) {
                          pcVar6 = "FAILED";
                        }
                        printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                        bVar2 = false;
                        fflush((FILE *)0x0);
                        if (bVar3) {
                          printf("%-29s","sort.h sqrt_sort");
                          dVar10 = 0.0;
                          for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                            puVar1 = (utimbuf *)sizes[uVar8];
                            puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                            pEVar7 = ctx;
                            fill((int64_t *)ctx,(int)puVar1,type);
                            utime((char *)pEVar7,puVar5);
                            puVar5 = puVar1;
                            pEVar7 = ctx;
                            sorter_sqrt_sort((int64_t *)ctx,(size_t)puVar1);
                            utime((char *)pEVar7,puVar5);
                            iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_11,
                                           (uchar *)tbs,in_R8);
                            if (iVar4 == 0) {
                              bVar2 = false;
                              break;
                            }
                            dVar10 = dVar10 + (extraout_XMM0_Qa_24 - extraout_XMM0_Qa_23);
                            bVar2 = true;
                          }
                          pcVar6 = "ok";
                          if (!bVar2) {
                            pcVar6 = "FAILED";
                          }
                          printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                          bVar3 = false;
                          fflush((FILE *)0x0);
                          if (bVar2) {
                            printf("%-29s","stdlib qsort");
                            dVar10 = 0.0;
                            for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                              puVar1 = (utimbuf *)sizes[uVar8];
                              puVar5 = (utimbuf *)((ulong)puVar1 & 0xffffffff);
                              pEVar7 = ctx;
                              fill((int64_t *)ctx,(int)puVar1,type);
                              utime((char *)pEVar7,puVar5);
                              tbs_00 = simple_cmp;
                              puVar5 = puVar1;
                              pEVar7 = ctx;
                              qsort(ctx,(size_t)puVar1,8,simple_cmp);
                              utime((char *)pEVar7,puVar5);
                              iVar4 = verify(ctx,(uchar *)((ulong)puVar1 & 0xffffffff),siglen_12,
                                             (uchar *)tbs_00,in_R8);
                              if (iVar4 == 0) {
                                bVar3 = false;
                                break;
                              }
                              dVar10 = dVar10 + (extraout_XMM0_Qa_26 - extraout_XMM0_Qa_25);
                              bVar3 = true;
                            }
                            pcVar6 = "ok";
                            if (!bVar3) {
                              pcVar6 = "FAILED";
                            }
                            printf(" - %s, %10.1f usec\n",dVar10,pcVar6);
                            fflush((FILE *)0x0);
                            if (bVar3) {
                              free(ctx);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int run_tests(int64_t *sizes, int sizes_cnt, int type) {
  int test, res;
  double usec1, usec2, diff;
  int64_t *dst = (int64_t *)malloc(MAXSIZE * sizeof(int64_t));
  printf("-------\nRunning tests with %s:\n", test_names[type]);
  TEST_EXTRA_H(yysort1_int64);
  TEST_EXTRA_H(yysort2_int64);
  // TEST_EXTRA_H(yysort1_int64_sb);
  // TEST_EXTRA_H(yysort2_int64_sb);
  // TEST_EXTRA_H(sort_rela589n_int64);
  TEST_EXTRA_H(radix_sort7_int64);

  TEST_SORT_H(tim_sort);
  TEST_SORT_H(quick_sort);
  TEST_EXTRA_H(std_sort_int64);
  TEST_EXTRA_H(std_stable_int64);
  TEST_SORT_H(heap_sort);
  TEST_SORT_H(merge_sort);
  TEST_SORT_H(shell_sort);
  TEST_SORT_H(merge_sort_in_place);
  TEST_SORT_H(grail_sort);
  TEST_SORT_H(sqrt_sort);
  // TEST_SORT_H(rec_stable_sort);
  // TEST_SORT_H(grail_sort_dyn_buffer);

  TEST_STDLIB(qsort);
#if !defined(__linux__) && !defined(__CYGWIN__)
  TEST_STDLIB(heapsort);
  TEST_STDLIB(mergesort);
#endif

  if (MAXSIZE < 10000) {
    TEST_SORT_H(selection_sort);
    TEST_SORT_H(bubble_sort);
    TEST_SORT_H(binary_insertion_sort);
    TEST_SORT_H(bitonic_sort);
  }
  free(dst);
  return 0;
}